

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform(Curl_easy *data,_Bool *connected,_Bool *dophase_done)

{
  _Bool _Var1;
  POP3 *pop3;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->req).field_0xd9 >> 0x11 & 1) != 0) {
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
  }
  *dophase_done = false;
  data_local._4_4_ = pop3_perform_command(data);
  if (data_local._4_4_ == CURLE_OK) {
    data_local._4_4_ = pop3_multi_statemach(data,dophase_done);
    _Var1 = Curl_conn_is_connected(data->conn,0);
    *connected = _Var1;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_perform(struct Curl_easy *data, bool *connected,
                             bool *dophase_done)
{
  /* This is POP3 and no proxy */
  CURLcode result = CURLE_OK;
  struct POP3 *pop3 = data->req.p.pop3;

  DEBUGF(infof(data, "DO phase starts"));

  if(data->req.no_body) {
    /* Requested no body means no transfer */
    pop3->transfer = PPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* Start the first command in the DO phase */
  result = pop3_perform_command(data);
  if(result)
    return result;

  /* Run the state-machine */
  result = pop3_multi_statemach(data, dophase_done);
  *connected = Curl_conn_is_connected(data->conn, FIRSTSOCKET);

  if(*dophase_done)
    DEBUGF(infof(data, "DO phase is complete"));

  return result;
}